

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void dynamic_switch_emulator_id(uint index)

{
  _Head_base<0UL,_Player_*,_false> _Var1;
  int iVar2;
  Player *pPVar3;
  uint *puVar4;
  uint channel;
  ulong uVar5;
  unique_lock<std::mutex> lock;
  Emulator_Id new_id;
  Emulator_Id old_id;
  unique_lock<std::mutex> local_80;
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  
  if (active_emulator_id != index) {
    Emulator_Id::Emulator_Id
              ((Emulator_Id *)local_48,
               emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
               super__Vector_impl_data._M_start + active_emulator_id);
    Emulator_Id::Emulator_Id
              ((Emulator_Id *)local_70,
               emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
               super__Vector_impl_data._M_start + index);
    pPVar3 = active_player();
    std::unique_lock<std::mutex>::unique_lock(&local_80,&pPVar3->mutex_);
    (*pPVar3->_vptr_Player[5])(pPVar3);
    if (local_48._0_4_ == local_70._0_4_) {
      (*pPVar3->_vptr_Player[7])(pPVar3,(ulong)(uint)local_70._4_4_);
    }
    else {
      _Var1._M_head_impl =
           player[(uint)local_70._0_4_]._M_t.
           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
           super__Head_base<0UL,_Player_*,_false>._M_head_impl;
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 0x38))
                (_Var1._M_head_impl,local_70._4_4_);
      iVar2 = (*pPVar3->_vptr_Player[10])(pPVar3);
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 0x58))(_Var1._M_head_impl,iVar2);
      iVar2 = (*pPVar3->_vptr_Player[0xf])(pPVar3);
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 0x70))(_Var1._M_head_impl,iVar2);
      puVar4 = &channel_map[0].bank_lsb;
      for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 200))
                  (_Var1._M_head_impl,uVar5 & 0xffffffff,puVar4[-1]);
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 0xd0))
                  (_Var1._M_head_impl,uVar5 & 0xffffffff,*puVar4);
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Player + 0xb8))
                  (_Var1._M_head_impl,uVar5 & 0xffffffff,((Program *)(puVar4 + -2))->gm);
        puVar4 = puVar4 + 3;
      }
    }
    active_emulator_id = index;
    std::unique_lock<std::mutex>::~unique_lock(&local_80);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  return;
}

Assistant:

void dynamic_switch_emulator_id(unsigned index)
{
    if (index == active_emulator_id)
        return;

    Emulator_Id old_id = emulator_ids[active_emulator_id];
    Emulator_Id new_id  = emulator_ids[index];

    Player &player = active_player();
    auto lock = player.take_lock();

    player.panic();
    if (old_id.player == new_id.player) {
        player.set_emulator(new_id.emulator);
    }
    else {
        Player &new_player = *::player[(unsigned)new_id.player];
        new_player.set_emulator(new_id.emulator);
        new_player.set_chip_count(player.chip_count());
        new_player.set_channel_alloc_mode(player.get_channel_alloc_mode());
        // transmit bank change and program change events
        for (unsigned channel = 0; channel < 16; ++channel) {
            new_player.rt_bank_change_msb(channel, channel_map[channel].bank_msb);
            new_player.rt_bank_change_lsb(channel, channel_map[channel].bank_lsb);
            new_player.rt_program_change(channel, channel_map[channel].gm);
        }
    }

    ::active_emulator_id = index;
}